

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O2

HighsDebugStatus debugCompareHighsInfoDouble(string *name,HighsOptions *options,double v0,double v1)

{
  HighsLogType HVar1;
  HighsLogType type;
  double dVar2;
  string value_adjective;
  
  HVar1 = 0;
  if ((v0 != v1) || (NAN(v0) || NAN(v1))) {
    dVar2 = highsRelativeDifference(v0,v1);
    value_adjective._M_dataplus._M_p = (pointer)&value_adjective.field_2;
    value_adjective._M_string_length = 0;
    value_adjective.field_2._M_local_buf[0] = '\0';
    if (dVar2 <= excessive_relative_solution_param_error) {
      if (dVar2 <= 1e-12) {
        std::__cxx11::string::assign((char *)&value_adjective);
        type = kVerbose;
        HVar1 = 0;
      }
      else {
        std::__cxx11::string::assign((char *)&value_adjective);
        type = kDetailed;
        HVar1 = type;
      }
    }
    else {
      std::__cxx11::string::assign((char *)&value_adjective);
      type = kError;
      HVar1 = kWarning;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,type,
                "SolutionPar:  %-9s relative difference of %9.4g for %s\n",dVar2,
                value_adjective._M_dataplus._M_p,(name->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&value_adjective);
  }
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoDouble(const string name,
                                             const HighsOptions& options,
                                             const double v0, const double v1) {
  if (v0 == v1) return HighsDebugStatus::kOk;
  double delta = highsRelativeDifference(v0, v1);
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  if (delta > excessive_relative_solution_param_error) {
    value_adjective = "Excessive";
    report_level = HighsLogType::kError;
    return_status = HighsDebugStatus::kError;
  } else if (delta > large_relative_solution_param_error) {
    value_adjective = "Large";
    report_level = HighsLogType::kDetailed;
    return_status = HighsDebugStatus::kWarning;
  } else {
    value_adjective = "OK";
    report_level = HighsLogType::kVerbose;
  }
  highsLogDev(options.log_options, report_level,
              "SolutionPar:  %-9s relative difference of %9.4g for %s\n",
              value_adjective.c_str(), delta, name.c_str());
  return return_status;
}